

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

void monster_add_to_group(chunk_conflict *c,monster *mon,monster_group *group)

{
  mon_group_list_entry **ppmVar1;
  wchar_t wVar2;
  mon_group_list_entry **ppmVar3;
  mon_group_list_entry *pmVar4;
  
  if (mon->group_info[0].index != group->index) {
    __assert_fail("mon->group_info[PRIMARY_GROUP].index == group->index",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-group.c"
                  ,0xec,
                  "void monster_add_to_group(struct chunk *, struct monster *, struct monster_group *)"
                 );
  }
  ppmVar1 = &group->member_list;
  ppmVar3 = ppmVar1;
  while( true ) {
    pmVar4 = *ppmVar3;
    if (pmVar4 == (mon_group_list_entry *)0x0) {
      pmVar4 = (mon_group_list_entry *)mem_zalloc(0x10);
      pmVar4->midx = mon->midx;
      pmVar4->next = *ppmVar1;
      *ppmVar1 = pmVar4;
      return;
    }
    if (pmVar4->midx == L'\xfffffffe') break;
    ppmVar3 = &pmVar4->next;
  }
  wVar2 = mon->midx;
  pmVar4->midx = wVar2;
  if (group->leader != L'\xfffffffe') {
    return;
  }
  group->leader = wVar2;
  return;
}

Assistant:

void monster_add_to_group(struct chunk *c, struct monster *mon,
						  struct monster_group *group)
{
	struct mon_group_list_entry *list_entry = group->member_list;

	/* Confirm we're adding to the right group */
	assert(mon->group_info[PRIMARY_GROUP].index == group->index);

	/* Replace any fake monster indices with the real one */
	while (list_entry) {
		if (list_entry->midx == MIDX_FAKE) {
			list_entry->midx = mon->midx;
			if (group->leader == MIDX_FAKE) {
				group->leader = mon->midx;
			}
			return;
		}
		list_entry = list_entry->next;
	}

	/* Make a new list entry and add it to the start of the list */
	list_entry = mem_zalloc(sizeof(struct mon_group_list_entry));
	list_entry->midx = mon->midx;
	list_entry->next = group->member_list;
	group->member_list = list_entry;
}